

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void anon_unknown.dwarf_568a9::testScanLineWithBadAttribute(char *file)

{
  int iVar1;
  char *pcVar2;
  MultiPartInputFile *pMVar3;
  InputPart ip;
  MultiPartInputFile multiin;
  TiledInputPart p;
  TiledInputFile f;
  InputFile in;
  InputPart local_80 [8];
  MultiPartInputFile local_78 [40];
  TiledInputFile local_50 [32];
  InputFile local_30 [32];
  
  iVar1 = Imf_3_4::globalThreadCount();
  pcVar2 = file;
  Imf_3_4::InputFile::InputFile(local_30,file,iVar1);
  readScanlineThing<Imf_3_4::InputFile>(local_30,SUB81(pcVar2,0));
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_78,file,iVar1,true);
  pMVar3 = local_78;
  Imf_3_4::InputPart::InputPart(local_80,pMVar3,0);
  readScanlineThing<Imf_3_4::InputPart>(local_80,SUB81(pMVar3,0));
  checkDeepTypesFailToLoad(file);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile(local_50,file,iVar1);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                ,0x10e,"void (anonymous namespace)::testScanLineWithBadAttribute(const char *)");
}

Assistant:

void
testScanLineWithBadAttribute (const char* file)
{
    bool caught;

    InputFile in (file);
    readScanlineThing (in, false);

    MultiPartInputFile multiin (file);
    InputPart          ip (multiin, 0);
    readScanlineThing (ip, false);

    checkDeepTypesFailToLoad (file);

    // trying to open it as a tiled file should also fail
    try
    {
        caught = false;
        TiledInputFile f (file);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);

    // trying to open it as a tiled part of a multipart file should fail
    try
    {
        caught = false;
        MultiPartInputFile multiin (file);
        TiledInputPart     p (multiin, 0);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);
}